

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O3

void __thiscall V2Voice::tick(V2Voice *this)

{
  V2Env::tick(this->env,this->gate);
  V2Env::tick(this->env + 1,this->gate);
  V2LFO::tick(this->lfo);
  V2LFO::tick(this->lfo + 1);
  this->volramp = (this->env[0].out * 0.0078125 - this->curvol) * this->inst->SRfciframe;
  return;
}

Assistant:

void tick()
    {
        for (int i=0; i < syVV2::NENV; i++)
            env[i].tick(gate);

        for (int i=0; i < syVV2::NLFO; i++)
            lfo[i].tick();

        // volume ramping slope
        volramp = (env[0].out / 128.0f - curvol) * inst->SRfciframe;
        DEBUG_PLOT_VAL(&curvol, curvol);
    }